

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_conversion.cpp
# Opt level: O1

void Am_HSV_To_RGB(float h,float s,float v,float *r,float *g,float *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if ((s != 0.0) || (fVar1 = v, fVar3 = v, NAN(s))) {
    if (360.0 <= h) {
      do {
        h = h + -360.0;
      } while (360.0 <= h);
    }
    fVar2 = h / 60.0;
    if (5 < (uint)(int)fVar2) {
      return;
    }
    fVar4 = (1.0 - s) * v;
    fVar6 = (1.0 - s * (fVar2 - (float)(int)fVar2)) * v;
    fVar5 = (1.0 - (1.0 - (fVar2 - (float)(int)fVar2)) * s) * v;
    fVar1 = fVar4;
    fVar3 = fVar4;
    switch((int)fVar2) {
    case 0:
      fVar1 = v;
      fVar3 = fVar5;
      v = fVar4;
      break;
    case 1:
      fVar1 = fVar6;
      fVar3 = v;
      v = fVar4;
      break;
    case 2:
      fVar3 = v;
      v = fVar5;
      break;
    case 3:
      fVar3 = fVar6;
      break;
    case 4:
      fVar1 = fVar5;
      break;
    case 5:
      fVar1 = v;
      v = fVar6;
    }
  }
  *r = fVar1;
  *g = fVar3;
  *b = v;
  return;
}

Assistant:

void
Am_HSV_To_RGB(float h, float s, float v, float &r, float &g, float &b)
{
  if (s == 0.0) {
    r = v;
    g = v;
    b = v;
  } else {
    while (h >= 360.0)
      h -= 360.0;
    h = h / 60.0f;
    int region = (int)h;
    float frac = h - (float)region;
    float p = v * (1 - s);
    float q = v * (1 - (s * frac));
    float t = v * (1 - (s * (1 - frac)));
    switch (region) {
    case 0:
      r = v;
      g = t;
      b = p;
      break;
    case 1:
      r = q;
      g = v;
      b = p;
      break;
    case 2:
      r = p;
      g = v;
      b = t;
      break;
    case 3:
      r = p;
      g = q;
      b = v;
      break;
    case 4:
      r = t;
      g = p;
      b = v;
      break;
    case 5:
      r = v;
      g = p;
      b = q;
      break;
    }
  }
}